

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void __thiscall
ArgsManager::AddArg(ArgsManager *this,string *name,string *help,uint flags,OptionsCategory *cat)

{
  long lVar1;
  uint in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  pVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
  *arg_map;
  size_t eq_index;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  ret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  string arg_name;
  Arg *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffed0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  
  __c = (char)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,bool>
            ((bool *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(char *)in_stack_fffffffffffffec0,
             (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (in_stack_fffffffffffffee0,__c,(size_type)in_stack_fffffffffffffed8);
  if (local_e8 ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                         (&in_stack_fffffffffffffe98->m_help_param);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffec0,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
             ,(size_type)in_stack_fffffffffffffeb0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
  std::
  map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
  ::operator[]((map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
                *)in_stack_fffffffffffffec0,
               (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (&in_stack_fffffffffffffe98->m_help_param);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffec0,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
             ,(size_type)in_stack_fffffffffffffeb0);
  std::__cxx11::string::string(local_e8,in_RSI);
  pVar2 = std::
          map<std::__cxx11::string,ArgsManager::Arg,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
          ::emplace<std::__cxx11::string&,ArgsManager::Arg>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb0,
                     (Arg *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  Arg::~Arg(in_stack_fffffffffffffe98);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("ret.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
                  ,0x242,
                  "void ArgsManager::AddArg(const std::string &, const std::string &, unsigned int, const OptionsCategory &)"
                 );
  }
  if ((in_ECX & 0x200) != 0) {
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<std::__cxx11::string&>
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(&in_stack_fffffffffffffe98->m_help_param);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::AddArg(const std::string& name, const std::string& help, unsigned int flags, const OptionsCategory& cat)
{
    Assert((flags & ArgsManager::COMMAND) == 0); // use AddCommand

    // Split arg name from its help param
    size_t eq_index = name.find('=');
    if (eq_index == std::string::npos) {
        eq_index = name.size();
    }
    std::string arg_name = name.substr(0, eq_index);

    LOCK(cs_args);
    std::map<std::string, Arg>& arg_map = m_available_args[cat];
    auto ret = arg_map.emplace(arg_name, Arg{name.substr(eq_index, name.size() - eq_index), help, flags});
    assert(ret.second); // Make sure an insertion actually happened

    if (flags & ArgsManager::NETWORK_ONLY) {
        m_network_only_args.emplace(arg_name);
    }
}